

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O2

bool __thiscall IPStats::LoadCsvFile(IPStats *this,char *file_name)

{
  FILE *__stream;
  char *pcVar1;
  IPStatsRecord *key;
  bool ipsr_stored;
  int last_err;
  char buf [1024];
  bool local_42d;
  int local_42c;
  char local_428 [1024];
  
  local_42c = 0;
  __stream = (FILE *)ithi_file_open_ex(file_name,"rt",&local_42c);
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Cannot open input file %s\n",file_name);
  }
  else {
    while( true ) {
      pcVar1 = fgets(local_428,0x400,__stream);
      if (pcVar1 == (char *)0x0) break;
      key = IPStatsRecord::ParseLine(local_428);
      local_42d = false;
      BinHash<IPStatsRecord>::InsertOrAdd(&this->ip_records,key,false,&local_42d);
      if (local_42d == false) {
        operator_delete(key);
      }
    }
    fclose(__stream);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool IPStats::LoadCsvFile(char const* file_name)
{
    bool ret = true;
    int last_err = 0;
    FILE* F = ithi_file_open_ex(file_name, "rt", &last_err);

    if (F == NULL) {
        fprintf(stderr, "Cannot open input file %s\n", file_name);
        ret = false;
    }
    else {
        char buf[1024];

        while (fgets(buf, 1024, F) != NULL) {
            IPStatsRecord* ipsr = IPStatsRecord::ParseLine(buf);

            if (ipsr != NULL) {
                bool ipsr_stored = false;
                this->ip_records.InsertOrAdd(ipsr, false, &ipsr_stored);
                if (!ipsr_stored) {
                    delete ipsr;
                }
            }
            else {
                fprintf(stderr, "Cannot parse: %s", buf);
            }
        }

        fclose(F);
    }
    return ret;
}